

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O2

void __thiscall QGraphicsItemPrivate::ensureSortedChildren(QGraphicsItemPrivate *this)

{
  long lVar1;
  iterator __first;
  iterator __last;
  ulong uVar2;
  
  if (((uint)*(ulong *)&this->field_0x160 >> 0x1d & 1) != 0) {
    *(ulong *)&this->field_0x160 = *(ulong *)&this->field_0x160 & 0xffffffffdfffffff;
    this->field_0x168 = this->field_0x168 | 0x20;
    if ((this->children).d.size != 0) {
      __first = QList<QGraphicsItem_*>::begin(&this->children);
      __last = QList<QGraphicsItem_*>::end(&this->children);
      std::
      __sort<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (__first,__last,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x58314e);
      uVar2 = 0xffffffffffffffff;
      do {
        if (uVar2 - (this->children).d.size == -1) {
          return;
        }
        lVar1 = uVar2 + 1;
        uVar2 = uVar2 + 1;
      } while (uVar2 == (uint)(((this->children).d.ptr[lVar1]->d_ptr).d)->siblingIndex);
      this->field_0x168 = this->field_0x168 & 0xdf;
    }
  }
  return;
}

Assistant:

inline void QGraphicsItemPrivate::ensureSortedChildren()
{
    if (needSortChildren) {
        needSortChildren = 0;
        sequentialOrdering = 1;
        if (children.isEmpty())
            return;
        std::sort(children.begin(), children.end(), qt_notclosestLeaf);
        for (int i = 0; i < children.size(); ++i) {
            if (children.at(i)->d_ptr->siblingIndex != i) {
                sequentialOrdering = 0;
                break;
            }
        }
    }
}